

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nhdp_2.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  rfc5444_writer_message *msg;
  char **argv_local;
  int argc_local;
  
  rfc5444_writer_init(&writer);
  rfc5444_writer_register_target(&writer,&out_if);
  lVar2 = rfc5444_writer_register_message(&writer,1,0);
  *(code **)(lVar2 + 0xd8) = addMessageHeader;
  rfc5444_writer_register_msgcontentprovider(&writer,&cpr,addrtlvs,4);
  BEGIN_TESTING(clear_elements);
  test();
  rfc5444_writer_cleanup(&writer);
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  struct rfc5444_writer_message *msg;

  rfc5444_writer_init(&writer);

  rfc5444_writer_register_target(&writer, &out_if);

  msg = rfc5444_writer_register_message(&writer, MSG_TYPE, false);
  msg->addMessageHeader = addMessageHeader;

  rfc5444_writer_register_msgcontentprovider(&writer, &cpr, addrtlvs, ARRAYSIZE(addrtlvs));

  BEGIN_TESTING(clear_elements);

  test();

  rfc5444_writer_cleanup(&writer);

  return FINISH_TESTING();
}